

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_start(nni_dialer *d,uint flags)

{
  _Bool _Var1;
  uint32_t uVar2;
  nni_aio *local_1f0;
  nni_aio *aiop;
  nni_aio aio;
  int rv;
  uint flags_local;
  nni_dialer *d_local;
  
  aio.a_reap_node.rn_next._0_4_ = NNG_OK;
  aio.a_reap_node.rn_next._4_4_ = flags;
  _Var1 = nni_atomic_flag_test_and_set(&d->d_started);
  if (_Var1) {
    d_local._4_4_ = NNG_ESTATE;
  }
  else {
    if ((aio.a_reap_node.rn_next._4_4_ & 2) == 0) {
      nni_aio_init((nni_aio *)&aiop,(nni_cb)0x0,(void *)0x0);
      local_1f0 = (nni_aio *)&aiop;
      nni_aio_start(local_1f0,(nni_aio_cancel_fn)0x0,(void *)0x0);
    }
    else {
      local_1f0 = (nni_aio *)0x0;
    }
    nni_mtx_lock(&d->d_mtx);
    d->d_user_aio = local_1f0;
    dialer_connect_start(d);
    nni_mtx_unlock(&d->d_mtx);
    if (local_1f0 != (nni_aio *)0x0) {
      nni_aio_wait(local_1f0);
      aio.a_reap_node.rn_next._0_4_ = nni_aio_result(local_1f0);
      nni_aio_fini(local_1f0);
    }
    uVar2 = nni_sock_id(d->d_sock);
    nng_log_info("NNG-DIAL","Starting dialer for socket<%u>",(ulong)uVar2);
    d_local._4_4_ = (nng_err)aio.a_reap_node.rn_next;
  }
  return d_local._4_4_;
}

Assistant:

int
nni_dialer_start(nni_dialer *d, unsigned flags)
{
	int      rv = 0;
	nni_aio  aio;
	nni_aio *aiop = NULL;

	if (nni_atomic_flag_test_and_set(&d->d_started)) {
		return (NNG_ESTATE);
	}

	if ((flags & NNG_FLAG_NONBLOCK) != 0) {
		aiop = NULL;
	} else {
		nni_aio_init(&aio, NULL, NULL);
		aiop = &aio;
		nni_aio_start(aiop, NULL, NULL);
	}

	nni_mtx_lock(&d->d_mtx);
	d->d_user_aio = aiop;
	dialer_connect_start(d);
	nni_mtx_unlock(&d->d_mtx);

	if (aiop != NULL) {
		nni_aio_wait(aiop);
		rv = nni_aio_result(aiop);
		nni_aio_fini(aiop);
	}

	nng_log_info("NNG-DIAL", "Starting dialer for socket<%u>",
	    nni_sock_id(d->d_sock));

	return (rv);
}